

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::sub(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  BasicType BVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  Literal local_60;
  Literal local_38;
  Literal *local_20;
  Literal *other_local;
  Literal *this_local;
  
  local_20 = other;
  other_local = this;
  this_local = __return_storage_ptr__;
  BVar1 = wasm::Type::getBasic(&this->type);
  switch(BVar1) {
  case none:
  case unreachable:
  case v128:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                       ,0x467);
  case i32:
    Literal(__return_storage_ptr__,(this->field_0).i32 - (local_20->field_0).i32);
    break;
  case i64:
    Literal(__return_storage_ptr__,
            (long)(this->field_0).gcData.
                  super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
            (local_20->field_0).i64);
    break;
  case f32:
    fVar2 = getf32(this);
    fVar3 = getf32(local_20);
    Literal(&local_38,fVar2 - fVar3);
    standardizeNaN(__return_storage_ptr__,&local_38);
    ~Literal(&local_38);
    break;
  case f64:
    dVar4 = getf64(this);
    dVar5 = getf64(local_20);
    Literal(&local_60,dVar4 - dVar5);
    standardizeNaN(__return_storage_ptr__,&local_60);
    ~Literal(&local_60);
    break;
  default:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                       ,0x469);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::sub(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(uint32_t(i32) - uint32_t(other.i32));
    case Type::i64:
      return Literal(uint64_t(i64) - uint64_t(other.i64));
    case Type::f32:
      return standardizeNaN(Literal(getf32() - other.getf32()));
    case Type::f64:
      return standardizeNaN(Literal(getf64() - other.getf64()));
    case Type::v128:
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("unexpected type");
}